

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidget::paint
          (QGraphicsProxyWidget *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  long lVar1;
  QRect QVar2;
  QRect QVar3;
  QRect QVar4;
  GraphicsItemFlags GVar5;
  long *plVar6;
  QWidget *this_00;
  long in_FS_OFFSET;
  int iVar8;
  undefined1 auVar7 [16];
  QRegion local_88;
  undefined8 uStack_80;
  QSizeF local_78;
  QRectF local_68;
  undefined1 local_48 [24];
  long local_30;
  
  QVar4._8_8_ = local_48._8_8_;
  QVar4._0_8_ = local_48._0_8_;
  QVar3._8_8_ = local_48._8_8_;
  QVar3._0_8_ = local_48._0_8_;
  QVar2._8_8_ = local_48._8_8_;
  QVar2._0_8_ = local_48._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  if ((((*(long *)(lVar1 + 0x208) != 0) &&
       (local_48._0_16_ = (undefined1  [16])QVar2, *(int *)(*(long *)(lVar1 + 0x208) + 4) != 0)) &&
      (local_48._0_16_ = (undefined1  [16])QVar3, *(long *)(lVar1 + 0x210) != 0)) &&
     (local_48._0_16_ = (undefined1  [16])QVar4,
     (*(byte *)(*(long *)(*(long *)(lVar1 + 0x210) + 0x20) + 9) & 0x80) != 0)) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = QGraphicsWidget::size((QGraphicsWidget *)this);
    local_88.d = (QRegionData *)0x0;
    uStack_80 = 0;
    QRectF::operator&(&local_68,&option->exposedRect);
    local_48._0_16_ = QRectF::toAlignedRect();
    auVar7._0_4_ = -(uint)(local_48._8_4_ < local_48._0_4_);
    iVar8 = -(uint)(local_48._12_4_ < local_48._4_4_);
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = iVar8;
    auVar7._12_4_ = iVar8;
    iVar8 = movmskpd(local_48._0_4_,auVar7);
    if (iVar8 == 0) {
      plVar6 = (long *)QPainter::device();
      iVar8 = (**(code **)(*plVar6 + 0x10))(plVar6);
      if (iVar8 != 1) {
        GVar5 = QGraphicsItem::flags((QGraphicsItem *)(this + 0x10));
        if (((uint)GVar5.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                   super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 0x10) != 0) {
          QPainter::setClipRect
                    ((QRect *)painter,(int)*(undefined8 *)(*(long *)(lVar1 + 0x210) + 0x20) + 0x14);
        }
      }
      if ((*(long *)(lVar1 + 0x208) == 0) || (*(int *)(*(long *)(lVar1 + 0x208) + 4) == 0)) {
        this_00 = (QWidget *)0x0;
      }
      else {
        this_00 = *(QWidget **)(lVar1 + 0x210);
      }
      local_68.xp = (qreal)local_48._0_8_;
      QRegion::QRegion(&local_88,(QRect *)local_48,Rectangle);
      QWidget::render(this_00,painter,(QPoint *)&local_68,&local_88,(RenderFlags)0x3);
      QRegion::~QRegion(&local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_D(QGraphicsProxyWidget);
    Q_UNUSED(widget);
    if (!d->widget || !d->widget->isVisible())
        return;

    // Filter out repaints on the window frame.
    const QRect exposedWidgetRect = (option->exposedRect & rect()).toAlignedRect();
    if (exposedWidgetRect.isEmpty())
        return;

    // When rendering to pdf etc. painting may go outside widget boundaries unless clipped
    if (painter->device()->devType() != QInternal::Widget && (flags() & ItemClipsChildrenToShape))
        painter->setClipRect(d->widget->geometry(), Qt::IntersectClip);

    d->widget->render(painter, exposedWidgetRect.topLeft(), exposedWidgetRect);
}